

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

NULLCArray __thiscall
NULLCMemory::read_bool_array(NULLCMemory *this,NULLCArray buffer,int offset,int elements)

{
  uint uVar1;
  char *error;
  NULLCArray NVar2;
  
  uVar1 = buffer.len;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else if (offset < 0) {
    error = "element count is negative";
  }
  else {
    if (uVar1 < (uint)buffer.ptr && (uint)offset <= (uint)buffer.ptr - uVar1) {
      NVar2 = nullcAllocateArrayTyped(1,offset);
      memcpy(NVar2.ptr,this + uVar1,(ulong)(uint)offset);
      return NVar2;
    }
    error = "buffer overflow";
  }
  nullcThrowError(error);
  return (NULLCArray)ZEXT812(0);
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}